

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O0

void setarrayvector(lua_State *L,Table *t,int size)

{
  TValue *local_28;
  int local_20;
  int i;
  int size_local;
  Table *t_local;
  lua_State *L_local;
  
  if ((ulong)(long)(size + 1) < 0x1000000000000000) {
    local_28 = (TValue *)luaM_realloc_(L,t->array,(long)t->sizearray << 4,(long)size << 4);
  }
  else {
    local_28 = (TValue *)luaM_toobig(L);
  }
  t->array = local_28;
  for (local_20 = t->sizearray; local_20 < size; local_20 = local_20 + 1) {
    t->array[local_20].tt = 0;
  }
  t->sizearray = size;
  return;
}

Assistant:

static void setarrayvector (lua_State *L, Table *t, int size) {
  int i;
  luaM_reallocvector(L, t->array, t->sizearray, size, TValue);
  for (i=t->sizearray; i<size; i++)
     setnilvalue(&t->array[i]);
  t->sizearray = size;
}